

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::BlockedPumpFrom
          (BlockedPumpFrom *this,PromiseFulfiller<unsigned_int> *fulfiller,AsyncPipe *pipe,
          AsyncInputStream *input,uint64_t amount)

{
  bool bVar1;
  Fault local_48;
  Fault f;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  AsyncPipe *pipe_local;
  PromiseFulfiller<unsigned_int> *fulfiller_local;
  BlockedPumpFrom *this_local;
  
  AsyncIoStream::AsyncIoStream(&this->super_AsyncIoStream);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_007db018;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&DAT_007db098;
  this->fulfiller = fulfiller;
  this->pipe = pipe;
  this->input = input;
  this->amount = amount;
  this->pumpedSoFar = 0;
  Canceler::Canceler(&this->canceler);
  Promise<void>::Promise(&this->checkEofTask,(void *)0x0);
  bVar1 = Maybe<kj::AsyncIoStream_&>::operator==(&pipe->state,(void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x1ea,FAILED,"pipe.state == nullptr","");
    _::Debug::Fault::fatal(&local_48);
  }
  Maybe<kj::AsyncIoStream_&>::operator=(&pipe->state,&this->super_AsyncIoStream);
  return;
}

Assistant:

BlockedPumpFrom(PromiseFulfiller<uint64_t>& fulfiller, AsyncPipe& pipe,
                    AsyncInputStream& input, uint64_t amount)
        : fulfiller(fulfiller), pipe(pipe), input(input), amount(amount) {
      KJ_REQUIRE(pipe.state == nullptr);
      pipe.state = *this;
    }